

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReductionTypeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint32_t uVar3;
  pointer pcVar4;
  _func_int **pp_Var5;
  long lVar6;
  bool bVar7;
  LogMessage *other;
  long *plVar8;
  long lVar9;
  size_type *psVar10;
  undefined1 *puVar11;
  Result *_result;
  long lVar12;
  long lVar13;
  string err;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  LogMessage local_60;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar7 = Result::good(__return_storage_ptr__);
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) goto LAB_0036c221;
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24
                  );
  lVar13 = (long)iVar2;
  std::operator+(&local_80,"Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_a0.field_2._M_allocated_capacity = *psVar10;
    local_a0.field_2._8_8_ = plVar8[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar10;
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  uVar3 = layer->_oneof_case_[0];
  if ((int)uVar3 < 0x4fb) {
    if ((int)uVar3 < 0x4ec) {
      if (uVar3 == 0x4e2) {
        if (uVar3 == 0x4e2) {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar11 = Specification::_ReduceL1LayerParams_default_instance_;
        }
        lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
        bVar7 = lVar9 == 0;
        if (!bVar7) {
          pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite).
                    _vptr_MessageLite;
          if ((SBORROW8((long)pp_Var5,-lVar13) == (long)pp_Var5 + lVar13 < 0) &&
             ((long)pp_Var5 < lVar13)) {
            lVar12 = 8;
            do {
              bVar7 = lVar9 * 8 == lVar12;
              if (bVar7) goto LAB_0036c1fe;
              lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->
                                       super_MessageLite)._vptr_MessageLite + lVar12);
            } while ((SBORROW8(lVar6,-lVar13) == lVar6 + lVar13 < 0) &&
                    (lVar12 = lVar12 + 8, lVar6 < lVar13));
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          goto LAB_0036c1f9;
        }
      }
      else if (uVar3 == 0x4e7) {
        if (uVar3 != 0x4e7) {
          puVar11 = Specification::_ReduceL2LayerParams_default_instance_;
        }
        else {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
        bVar7 = lVar9 == 0;
        if (!bVar7) {
          pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite).
                    _vptr_MessageLite;
          if ((SBORROW8((long)pp_Var5,-lVar13) == (long)pp_Var5 + lVar13 < 0) &&
             ((long)pp_Var5 < lVar13)) {
            lVar12 = 8;
            do {
              bVar7 = lVar9 * 8 == lVar12;
              if (bVar7) goto LAB_0036c1fe;
              lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->
                                       super_MessageLite)._vptr_MessageLite + lVar12);
            } while ((SBORROW8(lVar6,-lVar13) == lVar6 + lVar13 < 0) &&
                    (lVar12 = lVar12 + 8, lVar6 < lVar13));
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          goto LAB_0036c1f9;
        }
      }
      goto LAB_0036c1fe;
    }
    if (uVar3 != 0x4ec) {
      if (uVar3 == 0x4f1) {
        if (uVar3 == 0x4f1) {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar11 = Specification::_ReduceMinLayerParams_default_instance_;
        }
        lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
        bVar7 = lVar9 == 0;
        if (!bVar7) {
          pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite).
                    _vptr_MessageLite;
          if ((SBORROW8((long)pp_Var5,-lVar13) == (long)pp_Var5 + lVar13 < 0) &&
             ((long)pp_Var5 < lVar13)) {
            lVar12 = 8;
            do {
              bVar7 = lVar9 * 8 == lVar12;
              if (bVar7) goto LAB_0036c1fe;
              lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->
                                       super_MessageLite)._vptr_MessageLite + lVar12);
            } while ((SBORROW8(lVar6,-lVar13) == lVar6 + lVar13 < 0) &&
                    (lVar12 = lVar12 + 8, lVar6 < lVar13));
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          goto LAB_0036c1f9;
        }
      }
      else if (uVar3 == 0x4f6) {
        if (uVar3 != 0x4f6) {
          puVar11 = Specification::_ReduceSumLayerParams_default_instance_;
        }
        else {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
        bVar7 = lVar9 == 0;
        if (!bVar7) {
          pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite).
                    _vptr_MessageLite;
          if (((long)-iVar2 <= (long)pp_Var5) && ((long)pp_Var5 < lVar13)) {
            lVar12 = 8;
            do {
              bVar7 = lVar9 * 8 == lVar12;
              if (bVar7) goto LAB_0036c1fe;
              lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->
                                       super_MessageLite)._vptr_MessageLite + lVar12);
            } while ((-iVar2 <= lVar6) && (lVar12 = lVar12 + 8, lVar6 < lVar13));
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          goto LAB_0036c1f9;
        }
      }
      goto LAB_0036c1fe;
    }
    if (uVar3 != 0x4ec) {
      puVar11 = Specification::_ReduceMaxLayerParams_default_instance_;
    }
    else {
      puVar11 = *(undefined1 **)&layer->layer_;
    }
    lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
    bVar7 = lVar9 == 0;
    if (bVar7) goto LAB_0036c1fe;
    pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite)._vptr_MessageLite;
    if ((SBORROW8((long)pp_Var5,-lVar13) == (long)pp_Var5 + lVar13 < 0) && ((long)pp_Var5 < lVar13))
    {
      lVar12 = 8;
      do {
        bVar7 = lVar9 * 8 == lVar12;
        if (bVar7) goto LAB_0036c1fe;
        lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite).
                                 _vptr_MessageLite + lVar12);
      } while ((SBORROW8(lVar6,-lVar13) == lVar6 + lVar13 < 0) &&
              (lVar12 = lVar12 + 8, lVar6 < lVar13));
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
LAB_0036c1f9:
    if (bVar7) goto LAB_0036c1fe;
    bVar7 = false;
  }
  else {
    if ((int)uVar3 < 0x505) {
      if (uVar3 == 0x4fb) {
        if (uVar3 == 0x4fb) {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar11 = Specification::_ReduceProdLayerParams_default_instance_;
        }
        lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
        bVar7 = lVar9 == 0;
        if (!bVar7) {
          pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite).
                    _vptr_MessageLite;
          if (((long)-iVar2 <= (long)pp_Var5) && ((long)pp_Var5 < lVar13)) {
            lVar12 = 8;
            do {
              bVar7 = lVar9 * 8 == lVar12;
              if (bVar7) goto LAB_0036c1fe;
              lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->
                                       super_MessageLite)._vptr_MessageLite + lVar12);
            } while ((-iVar2 <= lVar6) && (lVar12 = lVar12 + 8, lVar6 < lVar13));
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          goto LAB_0036c1f9;
        }
      }
      else if (uVar3 == 0x500) {
        if (uVar3 != 0x500) {
          puVar11 = Specification::_ReduceMeanLayerParams_default_instance_;
        }
        else {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
        bVar7 = lVar9 == 0;
        if (!bVar7) {
          pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite).
                    _vptr_MessageLite;
          if (((long)-iVar2 <= (long)pp_Var5) && ((long)pp_Var5 < lVar13)) {
            lVar12 = 8;
            do {
              bVar7 = lVar9 * 8 == lVar12;
              if (bVar7) goto LAB_0036c1fe;
              lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->
                                       super_MessageLite)._vptr_MessageLite + lVar12);
            } while ((-iVar2 <= lVar6) && (lVar12 = lVar12 + 8, lVar6 < lVar13));
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          goto LAB_0036c1f9;
        }
      }
    }
    else if (uVar3 == 0x505) {
      if (uVar3 == 0x505) {
        puVar11 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar11 = Specification::_ReduceLogSumLayerParams_default_instance_;
      }
      lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
      bVar7 = lVar9 == 0;
      if (!bVar7) {
        pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite)._vptr_MessageLite
        ;
        if (((long)-iVar2 <= (long)pp_Var5) && ((long)pp_Var5 < lVar13)) {
          lVar12 = 8;
          do {
            bVar7 = lVar9 * 8 == lVar12;
            if (bVar7) goto LAB_0036c1fe;
            lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite
                                     )._vptr_MessageLite + lVar12);
          } while ((-iVar2 <= lVar6) && (lVar12 = lVar12 + 8, lVar6 < lVar13));
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
        goto LAB_0036c1f9;
      }
    }
    else if (uVar3 == 0x50a) {
      if (uVar3 == 0x50a) {
        puVar11 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar11 = Specification::_ReduceSumSquareLayerParams_default_instance_;
      }
      lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
      bVar7 = lVar9 == 0;
      if (!bVar7) {
        pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite)._vptr_MessageLite
        ;
        if (((long)-iVar2 <= (long)pp_Var5) && ((long)pp_Var5 < lVar13)) {
          lVar12 = 8;
          do {
            bVar7 = lVar9 * 8 == lVar12;
            if (bVar7) goto LAB_0036c1fe;
            lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite
                                     )._vptr_MessageLite + lVar12);
          } while ((-iVar2 <= lVar6) && (lVar12 = lVar12 + 8, lVar6 < lVar13));
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
        goto LAB_0036c1f9;
      }
    }
    else if (uVar3 == 0x50f) {
      if (uVar3 != 0x50f) {
        puVar11 = Specification::_ReduceLogSumExpLayerParams_default_instance_;
      }
      else {
        puVar11 = *(undefined1 **)&layer->layer_;
      }
      lVar9 = (long)(((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
      bVar7 = lVar9 == 0;
      if (!bVar7) {
        pp_Var5 = (((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite)._vptr_MessageLite
        ;
        if (((long)-iVar2 <= (long)pp_Var5) && ((long)pp_Var5 < lVar13)) {
          lVar12 = 8;
          do {
            bVar7 = lVar9 * 8 == lVar12;
            if (bVar7) goto LAB_0036c1fe;
            lVar6 = *(long *)((long)&(((InnerProductLayerParams *)puVar11)->bias_->super_MessageLite
                                     )._vptr_MessageLite + lVar12);
          } while ((-iVar2 <= lVar6) && (lVar12 = lVar12 + 8, lVar6 < lVar13));
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
        goto LAB_0036c1f9;
      }
    }
LAB_0036c1fe:
    bVar7 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return __return_storage_ptr__;
  }
LAB_0036c221:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReductionTypeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // all given axes should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";

        switch (layer.layer_case()) {
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL1:
                for (const auto& axis : layer.reducel1().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL2:
                for (const auto& axis : layer.reducel2().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMax:
                for (const auto& axis : layer.reducemax().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMin:
                for (const auto& axis : layer.reducemin().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSum:
                for (const auto& axis : layer.reducesum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceProd:
                for (const auto& axis : layer.reduceprod().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMean:
                for (const auto& axis : layer.reducemean().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSum:
                for (const auto& axis : layer.reducelogsum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSumSquare:
                for (const auto& axis : layer.reducesumsquare().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSumExp:
                for (const auto& axis : layer.reducelogsumexp().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;

            default:
                break;
        }
    }
    return Result();
}